

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Lf_Cut_t * Lf_ObjCutBest(Lf_Man_t *p,int i)

{
  int iVar1;
  uint uVar2;
  Lf_Bst_t *pLVar3;
  Gia_Man_t *pGVar4;
  uint *puVar5;
  long lVar6;
  
  if ((i < 0) || ((p->vOffsets).nSize <= i)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pLVar3 = p->pObjBests;
  iVar1 = (p->vOffsets).pArray[(uint)i];
  if (((uint)pLVar3[iVar1].Cut[0] & 1) == 0) {
    lVar6 = 1;
    if (((uint)pLVar3[iVar1].Cut[1] & 1) == 0) {
      Lf_ObjCutBest::CutSet[1]._0_4_ = pLVar3[iVar1].Delay[2];
      Lf_ObjCutBest::CutSet[1]._4_4_ = pLVar3[iVar1].Flow[2];
      pGVar4 = p->pGia;
      if (pGVar4->nObjs <= i) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      puVar5 = pGVar4->pMuxes;
      if ((puVar5 != (uint *)0x0) && (puVar5[(uint)i] != 0)) {
        Lf_ObjCutBest::CutSet[2]._0_4_ = -(uint)(p->pPars->fCutMin == 0) | 4;
        Lf_ObjCutBest::CutSet[3]._0_4_ = i - (*(uint *)(pGVar4->pObjs + (uint)i) & 0x1fffffff);
        Lf_ObjCutBest::CutSet[3]._4_4_ =
             i - (*(uint *)&pGVar4->pObjs[(uint)i].field_0x4 & 0x1fffffff);
        uVar2 = puVar5[(uint)i];
        if (uVar2 == 0) {
          Lf_ObjCutBest::CutSet[4]._0_4_ = 0xffffffff;
        }
        else {
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10c,"int Abc_Lit2Var(int)");
          }
          Lf_ObjCutBest::CutSet[4]._0_4_ = uVar2 >> 1;
        }
        Lf_ObjCutBest::CutSet[2]._4_4_ = Lf_ObjCutBest::CutSet[2]._4_4_ & 0x7fffff | 0x3800000;
        return (Lf_Cut_t *)Lf_ObjCutBest::CutSet;
      }
      __assert_fail("Gia_ObjIsMux(p->pGia, pMux)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x244,"Lf_Cut_t *Lf_MemLoadMuxCut(Lf_Man_t *, int, Lf_Cut_t *)");
    }
  }
  else {
    lVar6 = 0;
  }
  Lf_ObjCutBest::CutSet[1]._0_4_ = pLVar3[iVar1].Delay[lVar6];
  Lf_ObjCutBest::CutSet[1]._4_4_ = pLVar3[iVar1].Flow[lVar6];
  Lf_MemLoadCut(&p->vStoreOld,(uint)pLVar3[iVar1].Cut[lVar6] >> 1,i,
                (Lf_Cut_t *)Lf_ObjCutBest::CutSet,p->pPars->fCutMin,0);
  return (Lf_Cut_t *)Lf_ObjCutBest::CutSet;
}

Assistant:

static inline Lf_Cut_t * Lf_ObjCutBest( Lf_Man_t * p, int i )
{
    static word CutSet[LF_CUT_WORDS];
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, i );
    Lf_Cut_t * pCut = (Lf_Cut_t *)CutSet;
    int Index = Lf_BestCutIndex( pBest );
    pCut->Delay = pBest->Delay[Index];
    pCut->Flow  = pBest->Flow[Index];
    if ( Index == 2 )
        return Lf_MemLoadMuxCut( p, i, pCut );
    return Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[Index].Handle, i, pCut, p->pPars->fCutMin, 0 );
}